

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover_discover.cc
# Opt level: O3

void printHelp(ostream *os,string *command)

{
  undefined4 uVar1;
  int iVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int iVar6;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Usage: ",7);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(command->_M_dataplus)._M_p,command->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," <operation> [<args>]\n",0x16);
  local_50 = (long *)CONCAT71(local_50._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Available operations are:\n",0x1a);
  p_Var5 = reset_commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)
      reset_commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &reset_commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    iVar6 = 0;
    p_Var4 = reset_commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      iVar2 = *(int *)&p_Var4[1]._M_parent;
      if (*(int *)&p_Var4[1]._M_parent < iVar6) {
        iVar2 = iVar6;
      }
      iVar6 = iVar2;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 !=
             &reset_commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
    if ((_Rb_tree_header *)p_Var5 != &reset_commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
    {
      do {
        uVar1 = *(undefined4 *)&p_Var5[1]._M_parent;
        std::__ostream_insert<char,std::char_traits<char>>(os,"    ",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
        local_50 = local_40;
        std::__cxx11::string::_M_construct((ulong)&local_50,((char)iVar6 + '\x03') - (char)uVar1);
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,*(char **)(p_Var5 + 2),(long)p_Var5[2]._M_parent);
        local_50 = (long *)CONCAT71(local_50._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 !=
               &reset_commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
    }
  }
  local_50 = (long *)CONCAT71(local_50._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Available arguments are:\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"    -h, --help         Show this help and exit\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"    -f name=<name>     Filter by name\n",0x26);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"    -f serial=<serial> Filter by serial number\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"    -f mac=<mac>       Filter by MAC address\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"    -f iface=<mac>     Filter by interface name\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"    -f model=<model>   Filter by model name\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"    -y                 Assume \'yes\' for all queries\n",0x34);
  return;
}

Assistant:

static void printHelp(std::ostream &os, const std::string &command)
{
  os << command << " [<args>]\n";
  os << '\n';
  os << "-h, --help         Show this help and exit\n";
  os << "-f name=<name>     Filter by name\n";
  os << "-f serial=<serial> Filter by serial number\n";
  os << "-f mac=<mac>       Filter by MAC address\n";
  os << "-f iface=<mac>     Filter by interface name\n";
  os << "-f model=<model>   Filter by model name\n";
  os << "--iponly           Show only the IP addresses of discovered sensors\n";
  os << "--serialonly       Show only the serial number of discovered sensors\n";
}